

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name,bool build_it)

{
  bool bVar1;
  size_type sVar2;
  reference ppFVar3;
  Symbol SVar4;
  _Self local_58;
  _Self local_50;
  const_iterator it;
  FileDescriptor *file;
  Symbol result;
  bool build_it_local;
  string *name_local;
  DescriptorBuilder *this_local;
  anon_union_8_8_13f84498_for_Symbol_2 local_10;
  
  result.field_1._7_1_ = build_it;
  SVar4 = FindSymbolNotEnforcingDeps(this,name,build_it);
  result._0_8_ = SVar4.field_1;
  file._0_4_ = SVar4.type;
  bVar1 = Symbol::IsNull((Symbol *)&file);
  if (bVar1) {
    this_local = (DescriptorBuilder *)(ulong)(Type)file;
    local_10 = (anon_union_8_8_13f84498_for_Symbol_2)result._0_8_;
  }
  else if ((this->pool_->enforce_dependencies_ & 1U) == 0) {
    this_local = (DescriptorBuilder *)(ulong)(Type)file;
    local_10 = (anon_union_8_8_13f84498_for_Symbol_2)result._0_8_;
  }
  else {
    it._M_node = (_Base_ptr)Symbol::GetFile((Symbol *)&file);
    if ((it._M_node == (_Base_ptr)this->file_) ||
       (sVar2 = std::
                set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::count(&this->dependencies_,(key_type *)&it), sVar2 != 0)) {
      std::
      set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::erase(&this->unused_dependency_,(key_type *)&it);
      this_local = (DescriptorBuilder *)(ulong)(Type)file;
      local_10 = (anon_union_8_8_13f84498_for_Symbol_2)result._0_8_;
    }
    else {
      if ((Type)file == PACKAGE) {
        bVar1 = IsInPackage(this,this->file_,name);
        if (bVar1) {
          this_local = (DescriptorBuilder *)(ulong)(Type)file;
          local_10 = (anon_union_8_8_13f84498_for_Symbol_2)result._0_8_;
          goto LAB_004d9fc7;
        }
        local_50._M_node =
             (_Base_ptr)
             std::
             set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin(&this->dependencies_);
        while( true ) {
          local_58._M_node =
               (_Base_ptr)
               std::
               set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ::end(&this->dependencies_);
          bVar1 = std::operator!=(&local_50,&local_58);
          if (!bVar1) break;
          ppFVar3 = std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::
                    operator*(&local_50);
          if (*ppFVar3 != (FileDescriptor *)0x0) {
            ppFVar3 = std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::
                      operator*(&local_50);
            bVar1 = IsInPackage(this,*ppFVar3,name);
            if (bVar1) {
              this_local = (DescriptorBuilder *)(ulong)(Type)file;
              local_10 = (anon_union_8_8_13f84498_for_Symbol_2)result._0_8_;
              goto LAB_004d9fc7;
            }
          }
          std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>::operator++
                    (&local_50);
        }
      }
      this->possible_undeclared_dependency_ = (FileDescriptor *)it._M_node;
      std::__cxx11::string::operator=
                ((string *)&this->possible_undeclared_dependency_name_,(string *)name);
      this_local = (anonymous_namespace)::kNullSymbol;
      local_10 = DAT_006fe340;
    }
  }
LAB_004d9fc7:
  SVar4._0_8_ = (ulong)this_local & 0xffffffff;
  SVar4.field_1.descriptor = local_10.descriptor;
  return SVar4;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const string& name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    unused_dependency_.erase(file);
    return result;
  }

  if (result.type == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (std::set<const FileDescriptor*>::const_iterator it =
             dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be NULL if it was not found or had errors.
      if (*it != NULL && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}